

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS meshb_pos(FILE *file,REF_INT version,REF_FILEPOS *pos)

{
  size_t sVar1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  long temp_long;
  REF_FILEPOS *pRStack_28;
  int temp_int;
  REF_FILEPOS *pos_local;
  FILE *pFStack_18;
  REF_INT version_local;
  FILE *file_local;
  
  pRStack_28 = pos;
  pos_local._4_4_ = version;
  pFStack_18 = file;
  if (version < 3) {
    sVar1 = fread((void *)((long)&temp_long + 4),4,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x573,"meshb_pos","read double",1,sVar1);
      return 1;
    }
    *pRStack_28 = (long)temp_long._4_4_;
  }
  else {
    sVar1 = fread(&ref_private_status_reis_ai,8,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x570,"meshb_pos","read long",1,sVar1);
      return 1;
    }
    *pRStack_28 = ref_private_status_reis_ai;
  }
  return 0;
}

Assistant:

static REF_STATUS meshb_pos(FILE *file, REF_INT version, REF_FILEPOS *pos) {
  int temp_int;
  long temp_long;

  if (3 <= version) {
    REIS(1, fread(&temp_long, sizeof(temp_long), 1, file), "read long");
    *pos = temp_long;
  } else {
    REIS(1, fread(&temp_int, sizeof(temp_int), 1, file), "read double");
    *pos = temp_int;
  }

  return REF_SUCCESS;
}